

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O3

ON_3dPoint * __thiscall
ON_SubDFace::ControlNetCenterPoint(ON_3dPoint *__return_storage_ptr__,ON_SubDFace *this)

{
  ON_SubDVertex *this_00;
  ushort uVar1;
  ON_SubDEdgePtr *this_01;
  undefined1 auVar2 [16];
  undefined1 local_98 [16];
  double local_88;
  double local_78;
  undefined8 uStack_70;
  ON_3dPoint local_60;
  ON_3dVector local_48;
  
  if (this->m_edge_count < 3) {
LAB_00601a3b:
    __return_storage_ptr__->z = ON_3dPoint::NanPoint.z;
    local_98._0_8_ = ON_3dPoint::NanPoint.x;
    local_98._8_8_ = ON_3dPoint::NanPoint.y;
  }
  else {
    local_78 = 0.0;
    uStack_70 = 0;
    ON_3dPoint::ON_3dPoint((ON_3dPoint *)local_98,0.0,0.0,0.0);
    if (this->m_edge_count != 0) {
      this_01 = this->m_edge4;
      uVar1 = 0;
      do {
        if ((uVar1 == 4) && (this_01 = this->m_edgex, this_01 == (ON_SubDEdgePtr *)0x0))
        goto LAB_00601a3b;
        this_00 = ON_SubDEdgePtr::RelativeVertex(this_01,0);
        if (this_00 == (ON_SubDVertex *)0x0) goto LAB_00601a3b;
        ON_SubDVertex::ControlNetPoint(&local_60,this_00);
        ON_3dVector::ON_3dVector(&local_48,&local_60);
        ON_3dPoint::operator+=((ON_3dPoint *)local_98,&local_48);
        uVar1 = uVar1 + 1;
        this_01 = this_01 + 1;
      } while (uVar1 < this->m_edge_count);
      local_78 = (double)this->m_edge_count;
    }
    auVar2._8_8_ = local_78;
    auVar2._0_8_ = local_78;
    auVar2 = divpd(local_98,auVar2);
    __return_storage_ptr__->z = local_88 / local_78;
    local_98._0_8_ = auVar2._0_8_;
    local_98._8_8_ = auVar2._8_8_;
  }
  __return_storage_ptr__->x = (double)local_98._0_8_;
  __return_storage_ptr__->y = (double)local_98._8_8_;
  return __return_storage_ptr__;
}

Assistant:

const ON_3dPoint ON_SubDFace::ControlNetCenterPoint() const
{
  if (m_edge_count < 3)
    return ON_3dPoint::NanPoint;
  ON_3dPoint center(0.0, 0.0, 0.0);
  const ON_SubDEdgePtr* eptr = m_edge4;
  for (unsigned short fvi = 0; fvi < m_edge_count; ++fvi, ++eptr)
  {
    if (4 == fvi)
    {
      eptr = m_edgex;
      if ( nullptr == eptr)
        return ON_3dPoint::NanPoint;
    }
    const ON_SubDVertex* v = eptr->RelativeVertex(0);
    if ( nullptr == v)
      return ON_3dPoint::NanPoint;
    center += v->ControlNetPoint();
  }
  const double c = (double)m_edge_count;
  center.x /= c;
  center.y /= c;
  center.z /= c;
  return center;
}